

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O0

void limonp::Split(string *src,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *res,string *pattern,size_t maxsplit)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  ulong in_RCX;
  ulong in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  string sub;
  size_t end;
  size_t Start;
  value_type *in_stack_ffffffffffffff48;
  string *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string *this_00;
  string local_a0 [32];
  undefined4 local_80;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  string *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x152d54);
  local_28 = 0;
  local_30 = 0;
  std::__cxx11::string::string(local_50);
  do {
    uVar1 = local_28;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
LAB_00152ef3:
      local_80 = 1;
      std::__cxx11::string::~string(local_50);
      return;
    }
    local_30 = std::__cxx11::string::find_first_of(local_8,local_18);
    if ((local_30 == -1) ||
       (sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_10), local_20 <= sVar3)) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)local_8);
      this_00 = local_50;
      this = local_70;
      std::__cxx11::string::operator=(this_00,this);
      std::__cxx11::string::~string(this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,(value_type *)this);
      goto LAB_00152ef3;
    }
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_8);
    std::__cxx11::string::operator=(local_50,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_28 = local_30 + 1;
  } while( true );
}

Assistant:

inline void Split(const string& src, vector<string>& res, const string& pattern, size_t maxsplit = string::npos) {
  res.clear();
  size_t Start = 0;
  size_t end = 0;
  string sub;
  while(Start < src.size()) {
    end = src.find_first_of(pattern, Start);
    if(string::npos == end || res.size() >= maxsplit) {
      sub = src.substr(Start);
      res.push_back(sub);
      return;
    }
    sub = src.substr(Start, end - Start);
    res.push_back(sub);
    Start = end + 1;
  }
  return;
}